

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall stringToUnits_complex_Test::TestBody(stringToUnits_complex_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  char *in_R9;
  string local_408;
  AssertHelper local_3e8;
  Message local_3e0;
  allocator local_3d1;
  string local_3d0;
  precise_unit local_3b0;
  allocator local_399;
  string local_398;
  precise_unit local_378;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_330;
  Message local_328;
  allocator local_319;
  string local_318;
  precise_unit local_2f8;
  precise_unit local_2e8;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_;
  Message local_2b8;
  allocator local_2a9;
  string local_2a8;
  precise_unit local_288;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_5;
  Message local_260;
  allocator local_251;
  string local_250;
  precise_unit local_230;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_4;
  Message local_208;
  precise_unit local_200;
  precise_unit local_1f0;
  allocator local_1d9;
  string local_1d8;
  precise_unit local_1b8;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_3;
  Message local_190;
  allocator local_181;
  string local_180;
  precise_unit local_160;
  precise_unit local_150;
  precise_unit local_140;
  precise_unit local_130;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  allocator local_f9;
  string local_f8;
  precise_unit local_d8;
  precise_unit local_c8;
  precise_unit local_b8;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [3];
  allocator local_71;
  string local_70;
  precise_unit local_50;
  precise_unit local_40;
  precise_unit local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  stringToUnits_complex_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_40 = units::precise_unit::operator/
                       ((precise_unit *)units::precise::m,(precise_unit *)units::precise::s);
  local_30 = units::precise_unit::operator/(&local_40,(precise_unit *)units::precise::s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"meters per second per second",&local_71);
  uVar2 = units::getDefaultFlags();
  local_50 = units::unit_from_string(&local_70,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"precise::m / precise::s / precise::s",
             "unit_from_string(\"meters per second per second\")",&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x330,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_c8 = units::precise_unit::operator/
                       ((precise_unit *)units::precise::mile,(precise_unit *)units::precise::hr);
  local_b8 = units::precise_unit::operator/(&local_c8,(precise_unit *)units::precise::s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"miles per hour per second",&local_f9);
  uVar2 = units::getDefaultFlags();
  local_d8 = units::unit_from_string(&local_f8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_a8,"precise::mile / precise::hr / precise::s",
             "unit_from_string(\"miles per hour per second\")",&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x333,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_140 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::micro,(precise_unit *)units::precise::mol);
  units::precise_unit::precise_unit(&local_150,0.1,(precise_unit *)units::precise::L);
  local_130 = units::precise_unit::operator/(&local_140,&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"micromole per deciliter",&local_181);
  uVar2 = units::getDefaultFlags();
  local_160 = units::unit_from_string(&local_180,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_120,"precise::micro * precise::mol / (precise_unit(0.1, precise::L))"
             ,"unit_from_string(\"micromole per deciliter\")",&local_130,&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x336,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"$ per 24 hrs",&local_1d9);
  uVar2 = units::getDefaultFlags();
  local_1b8 = units::unit_from_string(&local_1d8,uVar2);
  units::precise_unit::precise_unit(&local_200,24.0,(precise_unit *)units::precise::hr);
  local_1f0 = units::precise_unit::operator/((precise_unit *)units::precise::currency,&local_200);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1a8,"unit_from_string(\"$ per 24 hrs\")",
             "precise::currency / precise_unit(24.0, precise::hr)",&local_1b8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x339,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_250,"kilogram / minute(Gasoline at 15.5 C)",&local_251);
  uVar2 = units::getDefaultFlags();
  local_230 = units::unit_from_string(&local_250,uVar2);
  testing::internal::CmpHelperNE<units::precise_unit,units::precise_unit>
            ((internal *)local_220,"unit_from_string(\"kilogram / minute(Gasoline at 15.5 C)\")",
             "precise::error",&local_230,(precise_unit *)units::precise::error);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x33d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"g/(8.h){shift}",&local_2a9);
  uVar2 = units::getDefaultFlags();
  local_288 = units::unit_from_string(&local_2a8,uVar2);
  testing::internal::CmpHelperNE<units::precise_unit,units::precise_unit>
            ((internal *)local_278,"unit_from_string(\"g/(8.h){shift}\")","precise::error",
             &local_288,(precise_unit *)units::precise::error);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x33e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  local_2e8 = units::precise_unit::operator*
                        ((precise_unit *)units::precise::ohm,(precise_unit *)units::precise::meter);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"statohm micrometer",&local_319);
  uVar2 = units::getDefaultFlags();
  local_2f8 = units::unit_from_string(&local_318,uVar2);
  local_2d1 = units::precise_unit::is_convertible(&local_2e8,&local_2f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_2d0,
               (AssertionResult *)
               "(precise::ohm * precise::meter) .is_convertible(unit_from_string(\"statohm micrometer\"))"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x341,pcVar3);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"coulomb/square meter",&local_399);
  uVar2 = units::getDefaultFlags();
  local_378 = units::unit_from_string(&local_398,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"ampere hour/square meter",&local_3d1);
  uVar2 = units::getDefaultFlags();
  local_3b0 = units::unit_from_string(&local_3d0,uVar2);
  local_361 = units::precise_unit::is_convertible(&local_378,&local_3b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_360,&local_361,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_408,(internal *)local_360,
               (AssertionResult *)
               "unit_from_string(\"coulomb/square meter\") .is_convertible(unit_from_string(\"ampere hour/square meter\"))"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x344,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  return;
}

Assistant:

TEST(stringToUnits, complex)
{
    EXPECT_EQ(
        precise::m / precise::s / precise::s,
        unit_from_string("meters per second per second"));
    EXPECT_EQ(
        precise::mile / precise::hr / precise::s,
        unit_from_string("miles per hour per second"));
    EXPECT_EQ(
        precise::micro * precise::mol / (precise_unit(0.1, precise::L)),
        unit_from_string("micromole per deciliter"));
    EXPECT_EQ(
        unit_from_string("$ per 24 hrs"),
        precise::currency / precise_unit(24.0, precise::hr));

    EXPECT_NE(
        unit_from_string("kilogram / minute(Gasoline at 15.5 C)"),
        precise::error);
    EXPECT_NE(unit_from_string("g/(8.h){shift}"), precise::error);

    EXPECT_TRUE((precise::ohm * precise::meter)
                    .is_convertible(unit_from_string("statohm micrometer")));
    EXPECT_TRUE(
        unit_from_string("coulomb/square meter")
            .is_convertible(unit_from_string("ampere hour/square meter")));
}